

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O2

void ImPlot::CalculateBins<float>
               (float *values,int count,ImPlotBin meth,ImPlotRange *range,int *bins_out,
               double *width_out)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  __type _Var4;
  double dVar5;
  double dVar6;
  
  switch(meth) {
  case -4:
    uVar3 = 0;
    uVar2 = 0;
    if (0 < count) {
      uVar2 = (ulong)(uint)count;
    }
    dVar5 = 0.0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      dVar5 = dVar5 + (double)values[uVar3] * (1.0 / (double)count);
    }
    dVar6 = 0.0;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      dVar6 = dVar6 + ((double)values[uVar3] - dVar5) * ((double)values[uVar3] - dVar5) *
                      (1.0 / ((double)count + -1.0));
    }
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    _Var4 = std::cbrt<int>(count);
    dVar5 = (dVar6 * 3.49) / _Var4;
    *width_out = dVar5;
    dVar5 = round((range->Max - range->Min) / dVar5);
    goto LAB_001aae68;
  case -3:
    _Var4 = std::cbrt<int>(count);
    dVar5 = _Var4 + _Var4;
    break;
  case -2:
    _Var4 = std::log2<int>(count);
    dVar5 = _Var4 + 1.0;
    break;
  case -1:
    dVar5 = (double)count;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    break;
  default:
    iVar1 = *bins_out;
    goto LAB_001aae6f;
  }
  dVar5 = ceil(dVar5);
LAB_001aae68:
  iVar1 = (int)dVar5;
  *bins_out = iVar1;
LAB_001aae6f:
  *width_out = (range->Max - range->Min) / (double)iVar1;
  return;
}

Assistant:

static inline void CalculateBins(const T* values, int count, ImPlotBin meth, const ImPlotRange& range, int& bins_out, double& width_out) {
    switch (meth) {
        case ImPlotBin_Sqrt:
            bins_out  = (int)ceil(sqrt(count));
            break;
        case ImPlotBin_Sturges:
            bins_out  = (int)ceil(1.0 + log2(count));
            break;
        case ImPlotBin_Rice:
            bins_out  = (int)ceil(2 * cbrt(count));
            break;
        case ImPlotBin_Scott:
            width_out = 3.49 * ImStdDev(values, count) / cbrt(count);
            bins_out  = (int)round(range.Size() / width_out);
            break;
    }
    width_out = range.Size() / bins_out;
}